

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void lj_gc_freeall(global_State *g)

{
  uint uVar1;
  GCRef *in_RDI;
  global_State *unaff_retaddr;
  MSize strmask;
  MSize i;
  uint32_t in_stack_fffffffffffffff4;
  uint lim;
  
  *(undefined1 *)&in_RDI[0x16].gcptr32 = 0x43;
  gc_sweep(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4);
  uVar1 = in_RDI[2].gcptr32;
  for (lim = 0; lim <= uVar1; lim = lim + 1) {
    gc_sweep(unaff_retaddr,in_RDI,lim);
  }
  return;
}

Assistant:

void lj_gc_freeall(global_State *g)
{
  MSize i, strmask;
  /* Free everything, except super-fixed objects (the main thread). */
  g->gc.currentwhite = LJ_GC_WHITES | LJ_GC_SFIXED;
  gc_fullsweep(g, &g->gc.root);
  strmask = g->strmask;
  for (i = 0; i <= strmask; i++)  /* Free all string hash chains. */
    gc_fullsweep(g, &g->strhash[i]);
}